

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O2

bool IfProtected(int player,int to,Situation *situation,int exp)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  UINT8 *pUVar7;
  int i;
  int iVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  ushort uVar12;
  uint uVar13;
  
  if ((situation->current_board[to] != 0) &&
     ((uint)((situation->current_board[to] & 0x10) == 0) != player)) {
    return false;
  }
  iVar8 = player * 0x10;
  uVar1 = iVar8 + 0x10;
  lVar11 = (long)(int)uVar1;
  if ((to & 0x80U) == player << 7) {
    lVar6 = (long)(to + -1);
    do {
      lVar5 = lVar6;
      if (to + 1 < lVar5) goto LAB_00109bdc;
      lVar6 = lVar5 + 2;
    } while (((exp == lVar5) || ((uVar1 & situation->current_board[lVar5]) == 0)) ||
            ((situation->current_board[lVar5] & 0xf) < 0xb));
LAB_00109ae0:
    bVar3 = true;
  }
  else {
    pUVar7 = LEGAL_POSITION[player] + to;
    iVar9 = to + 0x100;
    for (lVar6 = lVar11; lVar6 <= lVar11; lVar6 = lVar6 + 1) {
      bVar2 = situation->current_pieces[lVar6];
      if ((((bVar2 != 0) && ((*pUVar7 & 2) != 0)) && ((uint)bVar2 != exp)) &&
         (""[(int)(iVar9 - (uint)bVar2)] == '\x01')) goto LAB_00109ae0;
    }
    for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
      bVar2 = situation->current_pieces[lVar6 + lVar11 + 1];
      if (((bVar2 != 0) && ((*pUVar7 & 4) != 0)) &&
         (((uint)bVar2 != exp && (""[(int)(iVar9 - (uint)bVar2)] == '\x02')))) goto LAB_00109ae0;
    }
    for (lVar6 = lVar11; lVar6 + 3 <= (long)(iVar8 + 0x14); lVar6 = lVar6 + 1) {
      if (((situation->current_pieces[lVar6 + 3] != 0) && ((*pUVar7 & 0x10) != 0)) &&
         ((uVar4 = (uint)situation->current_pieces[lVar6 + 3], ""[(int)(iVar9 - uVar4)] == '\x03' &&
          ((uVar4 != exp && (situation->current_board[(int)(uVar4 + to) >> 1] == '\0'))))))
      goto LAB_00109ae0;
    }
LAB_00109bdc:
    for (lVar6 = lVar11; lVar6 + 5 <= (long)(iVar8 + 0x16); lVar6 = lVar6 + 1) {
      if (situation->current_pieces[lVar6 + 5] != 0) {
        uVar4 = (uint)situation->current_pieces[lVar6 + 5];
        if (((HORSE_LEGAL_MOVE[(int)((to + 0x100) - uVar4)] != 0) && (uVar4 != exp)) &&
           (situation->current_board[(int)(HORSE_LEGAL_MOVE[(int)((to + 0x100) - uVar4)] + uVar4)]
            == '\0')) goto LAB_00109ae0;
      }
    }
    uVar10 = to & 0xf;
    uVar4 = to >> 4;
    for (lVar6 = lVar11; lVar6 + 7 <= (long)(iVar8 + 0x18); lVar6 = lVar6 + 1) {
      bVar2 = situation->current_pieces[lVar6 + 7];
      if ((uint)bVar2 != to && bVar2 != 0) {
        uVar13 = bVar2 & 0xf;
        if (bVar2 >> 4 == uVar4) {
          if ((uint)bVar2 != exp) {
            uVar12 = BIT_ROW_MASK[to] &
                     *(ushort *)
                      ((ulong)(uVar13 << 0xc) + 0x321d42 + (ulong)situation->bit_row[uVar4] * 8);
joined_r0x00109cf1:
            if (uVar12 != 0) goto LAB_00109ae0;
          }
        }
        else if ((uVar13 == uVar10) && ((uint)bVar2 != exp)) {
          uVar12 = BIT_COL_MASK[to] &
                   *(ushort *)
                    ((ulong)(bVar2 >> 4) * 0x2000 + 0x327d42 + (ulong)situation->bit_col[uVar10] * 8
                    );
          goto joined_r0x00109cf1;
        }
      }
    }
    for (; lVar11 + 9 <= (long)(iVar8 + 0x1a); lVar11 = lVar11 + 1) {
      bVar2 = situation->current_pieces[lVar11 + 9];
      if ((uint)bVar2 != to && bVar2 != 0) {
        uVar13 = bVar2 & 0xf;
        if (bVar2 >> 4 == uVar4) {
          if ((uint)bVar2 != exp) {
            uVar12 = BIT_ROW_MASK[to] &
                     *(ushort *)
                      ((ulong)(uVar13 << 0xc) + 0x321d44 + (ulong)situation->bit_row[uVar4] * 8);
joined_r0x00109dad:
            if (uVar12 != 0) goto LAB_00109ae0;
          }
        }
        else if ((uVar13 == uVar10) && ((uint)bVar2 != exp)) {
          uVar12 = BIT_COL_MASK[to] &
                   *(ushort *)
                    ((ulong)(bVar2 >> 4) * 0x2000 + 0x327d44 + (ulong)situation->bit_col[uVar10] * 8
                    );
          goto joined_r0x00109dad;
        }
      }
    }
    iVar8 = to + player * -0x20 + 0x10;
    bVar3 = (iVar8 != exp && (uVar1 & situation->current_board[iVar8]) != 0) &&
            10 < (situation->current_board[iVar8] & 0xf);
  }
  return bVar3;
}

Assistant:

bool IfProtected(int player, const int to, const Situation & situation, int exp){
    // 对手的player_flag
    int player_flag = GetPlayerFlag(player);

    // 对手的棋子所在的位置，即判断保护的from
    int from;
    if(situation.current_board[to] != 0 && ColorOfPiece(situation.current_board[to]) != player) 
        return false;
    
    // 是否过河
    if(InHomeHalf(to, player)){
        // 被将(帅)保护
        for(int i = player_flag + 0; i <= player_flag + 0; i ++){
            from = situation.current_pieces[i];
            if (from && (LEGAL_POSITION[player][to] & POSITION_MASK[0]) && (LEGAL_MOVE[to - from + 256] == 1) && from != exp)
                return true;
        }

        // 被士(仕)保护
        for(int i = player_flag + 1; i <= player_flag + 2; i ++){
            from = situation.current_pieces[i];
            if (from && (LEGAL_POSITION[player][to] & POSITION_MASK[1]) && (LEGAL_MOVE[to - from + 256] == 2) && from != exp)
                return true;
        }

        // 被象(相)保护
        for(int i = player_flag + 3; i <= player_flag + 4; i ++){
            from = situation.current_pieces[i];
            if(from && (LEGAL_POSITION[player][to] & POSITION_MASK[2]) && (LEGAL_MOVE[to - from + 256] == 3) && (situation.current_board[(to + from) >> 1] == 0) && from != exp)
                return true;
        }
    }
    else{
        // 被兵保护(横向)
        for(from = to - 1; from <= to + 1; from += 2){
            int from_id = situation.current_board[from];
            if(((from_id & player_flag) != 0) && ((from_id & 15) >= 11) && from != exp)
                return true;
        }
    }

    // 被马保护
    for(int i = player_flag + 5; i <= player_flag + 6; i ++){
        from = situation.current_pieces[i];
        int horse_leg = HORSE_LEGAL_MOVE[to - from + 256] + from;
        if(from && horse_leg != from && situation.current_board[horse_leg] == 0 && from != exp)
            return true;
    }

    int from_col = GetCol(from), from_row = GetRow(from), to_col = GetCol(to), to_row = GetRow(to);

    // 被车保护
    for(int i = player_flag + 7; i <= player_flag + 8; i ++){
        from = situation.current_pieces[i];
        from_col = GetCol(from);
        from_row = GetRow(from);
        if(from && from != to){
            if(from_row == to_row){
                if((ROOK_CANNON_CAN_GET_ROW_MASK[from_col - 3][situation.bit_row[from_row]].rook_capture & BIT_ROW_MASK[to]) != 0 && from != exp)
                    return true;
            }
            else if(from_col == to_col){
                if((ROOK_CANNON_CAN_GET_COL_MASK[from_row - 3][situation.bit_col[from_col]].rook_capture & BIT_COL_MASK[to]) != 0 && from != exp)
                    return true;
            }
        }
    }

    // 被炮保护
    for(int i = player_flag + 9; i <= player_flag + 10; i ++){
        from = situation.current_pieces[i];
        from_col = GetCol(from);
        from_row = GetRow(from);
        if(from && from != to){
            if(from_row == to_row){
                if((ROOK_CANNON_CAN_GET_ROW_MASK[from_col - 3][situation.bit_row[from_row]].cannon_capture & BIT_ROW_MASK[to]) != 0 && from != exp)
                    return true;
            }
            else if(from_col == to_col){
                if((ROOK_CANNON_CAN_GET_COL_MASK[from_row - 3][situation.bit_col[from_col]].cannon_capture & BIT_COL_MASK[to]) != 0 && from != exp)
                    return true;
            }
        }
    }

    // 被兵保护(纵向)
    from = SquareBack(to, player);
    int from_id = situation.current_board[from];
    if(((from_id & player_flag) != 0) && ((from_id & 15) >= 11) && from != exp)
        return true;

    return false;
}